

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JsonReporter::assertionEnded(JsonReporter *this,AssertionStats *assertionStats)

{
  byte bVar1;
  size_t __n;
  void *__buf;
  _Elt_pointer pJVar2;
  JsonObjectWriter assertionObject;
  JsonValueWriter local_1a8;
  
  pJVar2 = (this->m_arrayWriters).c.
           super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_arrayWriters).c.
                super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_arrayWriters).c.
             super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonArrayWriter::writeObject(&assertionObject,pJVar2 + -1);
  __n = 4;
  JsonObjectWriter::write((JsonObjectWriter *)&local_1a8,(int)&assertionObject,"kind",4);
  JsonValueWriter::write(&local_1a8,0x16cb6f,(void *)0x9,__n);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8.m_sstream);
  local_1a8.m_os = (ostream *)(assertionStats->assertionResult).m_info.lineInfo.file;
  local_1a8._8_8_ = (assertionStats->assertionResult).m_info.lineInfo.line;
  anon_unknown_26::writeSourceInfo(&assertionObject,(SourceLineInfo *)&local_1a8);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1a8,(int)&assertionObject,"status",6);
  bVar1 = (byte)(((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) >> 3) |
          ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok;
  JsonValueWriter::write(&local_1a8,(uint)bVar1,__buf,(ulong)bVar1);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8.m_sstream);
  JsonObjectWriter::~JsonObjectWriter(&assertionObject);
  return;
}

Assistant:

void JsonReporter::assertionEnded( AssertionStats const& assertionStats ) {
        // TODO: There is lot of different things to handle here, but
        //       we can fill it in later, after we show that the basic
        //       outline and streaming reporter impl works well enough.
        //if ( !m_config->includeSuccessfulResults()
        //    && assertionStats.assertionResult.isOk() ) {
        //    return;
        //}
        assert( isInside( Writer::Array ) );
        auto assertionObject = m_arrayWriters.top().writeObject();

        assertionObject.write( "kind"_sr ).write( "assertion"_sr );
        writeSourceInfo( assertionObject,
                         assertionStats.assertionResult.getSourceInfo() );
        assertionObject.write( "status"_sr )
            .write( assertionStats.assertionResult.isOk() );
        // TODO: handling of result.
        // TODO: messages
        // TODO: totals?
    }